

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O1

t_int * osc_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  t_int tVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  
  pfVar5 = cos_table;
  lVar2 = w[1];
  pfVar3 = (float *)w[2];
  pfVar6 = (float *)w[3];
  tVar4 = w[4];
  dVar12 = *(double *)(lVar2 + 0x30) + 1572864.0;
  fVar1 = *(float *)(lVar2 + 0x38);
  dVar10 = (double)(*pfVar3 * fVar1) + dVar12;
  fVar11 = (float)((double)((ulong)dVar12 & 0xffffffff | 0x4138000000000000) + -1572864.0);
  pfVar8 = cos_table + ((uint)((ulong)dVar12 >> 0x20) & 0x1ff);
  if ((int)tVar4 != 1) {
    lVar9 = 0;
    lVar7 = 0;
    dVar12 = dVar10;
    do {
      dVar10 = (double)(pfVar3[lVar7 + 1] * fVar1) + dVar12;
      pfVar6[lVar7] = (pfVar8[1] - *pfVar8) * fVar11 + *pfVar8;
      fVar11 = (float)((double)((ulong)dVar12 & 0xffffffff | 0x4138000000000000) + -1572864.0);
      pfVar8 = pfVar5 + ((uint)((ulong)dVar12 >> 0x20) & 0x1ff);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + -4;
      dVar12 = dVar10;
    } while ((int)tVar4 + -1 != (int)lVar7);
    pfVar6 = (float *)((long)pfVar6 - lVar9);
  }
  *pfVar6 = (pfVar8[1] - *pfVar8) * fVar11 + *pfVar8;
  *(double *)(lVar2 + 0x30) =
       (double)((ulong)(dVar10 + 803733504.0) & 0xffffffff | 0x41c8000000000000) + -805306368.0;
  return w + 5;
}

Assistant:

static t_int *osc_perform(t_int *w)
{
    t_osc *x = (t_osc *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    float *tab = cos_table, *addr;
    t_float f1, f2, frac;
    double dphase = x->x_phase + UNITBIT32;
    int normhipart;
    union tabfudge tf;
    float conv = x->x_conv;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];
#if 0
    while (n--)
    {
        tf.tf_d = dphase;
        dphase += *in++ * conv;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        *out++ = f1 + frac * (f2 - f1);
    }
#endif
#if 1
        tf.tf_d = dphase;
        dphase += *in++ * conv;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
    while (--n)
    {
        tf.tf_d = dphase;
            f1 = addr[0];
        dphase += *in++ * conv;
            f2 = addr[1];
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
            *out++ = f1 + frac * (f2 - f1);
        frac = tf.tf_d - UNITBIT32;
    }
            f1 = addr[0];
            f2 = addr[1];
            *out++ = f1 + frac * (f2 - f1);
#endif

    tf.tf_d = UNITBIT32 * COSTABSIZE;
    normhipart = tf.tf_i[HIOFFSET];
    tf.tf_d = dphase + (UNITBIT32 * COSTABSIZE - UNITBIT32);
    tf.tf_i[HIOFFSET] = normhipart;
    x->x_phase = tf.tf_d - UNITBIT32 * COSTABSIZE;
    return (w+5);
}